

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::fastcgi::on_some_input_recieved
          (fastcgi *this,error_code *e,io_handler *h,pair<void_*,_unsigned_long> in)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  error_code local_10;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(h,e,0);
    return;
  }
  if ((((this->header_).type == '\x05') && (this->request_id_ == (uint)(this->header_).request_id))
     && ((this->header_).content_length != 0)) {
    UNRECOVERED_JUMPTABLE = (this->super_connection)._vptr_connection[0x11];
    (*UNRECOVERED_JUMPTABLE)(this,in.first,in.second,h,in.second,UNRECOVERED_JUMPTABLE);
    return;
  }
  local_10._M_value = 1;
  local_10._M_cat = (error_category *)&cppcms_category;
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(h,&local_10,0);
  return;
}

Assistant:

void on_some_input_recieved(booster::system::error_code const &e,io_handler const &h,std::pair<void *,size_t> in)
		{
			if(e) { h(e,0); return; }
			if(	header_.type!=fcgi_stdin 
				|| header_.request_id!=request_id_ 
				|| header_.content_length==0)
			{
				h(booster::system::error_code(errc::protocol_violation,cppcms_category),0);
				return;
			}
			async_read_some(in.first,in.second,h);
		}